

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

void Vec_IntPush(Vec_Int_t *p,int Entry)

{
  int iVar1;
  int Entry_local;
  Vec_Int_t *p_local;
  
  if (p->nSize == p->nCap) {
    if (p->nCap < 0x10) {
      Vec_IntGrow(p,0x10);
    }
    else {
      Vec_IntGrow(p,p->nCap << 1);
    }
  }
  iVar1 = p->nSize;
  p->nSize = iVar1 + 1;
  p->pArray[iVar1] = Entry;
  return;
}

Assistant:

static inline void Vec_IntPush( Vec_Int_t * p, int Entry )
{
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Vec_IntGrow( p, 16 );
        else
            Vec_IntGrow( p, 2 * p->nCap );
    }
    p->pArray[p->nSize++] = Entry;
}